

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_FFDHE.c
# Opt level: O0

void ffdhe_compute_exp(Spec_FFDHE_ffdhe_alg a,uint64_t *p_r2_n,uint64_t *sk_n,uint64_t *b_n,
                      uint8_t *res)

{
  uint64_t uVar1;
  long lVar2;
  uint64_t *r2;
  uint64_t *n;
  uint8_t *puVar3;
  Spec_FFDHE_ffdhe_alg SVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint64_t *puVar7;
  uint32_t bBits;
  uint64_t *apuStack_80 [4];
  uint64_t local_60;
  uint64_t mu;
  unsigned_long __vla_expr0;
  uint64_t *local_48;
  uint64_t *r2_n;
  uint64_t *p_n;
  uint8_t *puStack_30;
  uint32_t nLen;
  uint8_t *res_local;
  uint64_t *b_n_local;
  uint64_t *sk_n_local;
  uint64_t *p_r2_n_local;
  Spec_FFDHE_ffdhe_alg a_local;
  
  apuStack_80[2] = (uint64_t *)0x24c1a7;
  puStack_30 = res;
  res_local = (uint8_t *)b_n;
  b_n_local = sk_n;
  sk_n_local = p_r2_n;
  p_r2_n_local._7_1_ = a;
  uVar5 = ffdhe_len(a);
  p_n._4_4_ = (uVar5 - 1 >> 3) + 1;
  r2_n = sk_n_local;
  local_48 = sk_n_local + p_n._4_4_;
  if (0x1fffffffffffffff < (ulong)p_n._4_4_) {
    apuStack_80[2] = (uint64_t *)0x24c1f9;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_FFDHE.c"
           ,0xe8);
    apuStack_80[2] = (uint64_t *)0x24c203;
    exit(0xfd);
  }
  mu = (uint64_t)p_n._4_4_;
  lVar2 = -(mu * 8 + 0xf & 0xfffffffffffffff0);
  puVar7 = (uint64_t *)((long)apuStack_80 + lVar2 + 0x18);
  uVar6 = (ulong)p_n._4_4_;
  apuStack_80[3] = puVar7;
  __vla_expr0 = (unsigned_long)(apuStack_80 + 3);
  *(undefined8 *)((long)apuStack_80 + lVar2 + 0x10) = 0x24c23c;
  memset(puVar7,0,uVar6 << 3);
  uVar1 = *r2_n;
  *(undefined8 *)((long)apuStack_80 + lVar2 + 0x10) = 0x24c248;
  local_60 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar1);
  SVar4 = p_r2_n_local._7_1_;
  *(undefined8 *)((long)apuStack_80 + lVar2 + 0x10) = 0x24c255;
  uVar5 = ffdhe_len(SVar4);
  puVar3 = res_local;
  n = r2_n;
  r2 = local_48;
  uVar1 = local_60;
  puVar7 = apuStack_80[3];
  bBits = p_n._4_4_ << 6;
  *(uint64_t **)((long)apuStack_80 + lVar2 + 8) = b_n_local;
  *(uint64_t **)((long)apuStack_80 + lVar2 + 0x10) = puVar7;
  *(undefined8 *)((long)apuStack_80 + lVar2) = 0x24c292;
  Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
            ((uVar5 - 1 >> 3) + 1,n,uVar1,r2,(uint64_t *)puVar3,bBits,
             *(uint64_t **)((long)apuStack_80 + lVar2 + 8),
             *(uint64_t **)((long)apuStack_80 + lVar2 + 0x10));
  SVar4 = p_r2_n_local._7_1_;
  *(undefined8 *)((long)apuStack_80 + lVar2 + 0x10) = 0x24c29f;
  uVar5 = ffdhe_len(SVar4);
  puVar3 = puStack_30;
  puVar7 = apuStack_80[3];
  *(undefined8 *)((long)apuStack_80 + lVar2 + 0x10) = 0x24c2ae;
  Hacl_Bignum_Convert_bn_to_bytes_be_uint64(uVar5,puVar7,puVar3);
  return;
}

Assistant:

static inline void
ffdhe_compute_exp(
  Spec_FFDHE_ffdhe_alg a,
  uint64_t *p_r2_n,
  uint64_t *sk_n,
  uint64_t *b_n,
  uint8_t *res
)
{
  uint32_t nLen = (ffdhe_len(a) - 1U) / 8U + 1U;
  uint64_t *p_n = p_r2_n;
  uint64_t *r2_n = p_r2_n + nLen;
  KRML_CHECK_SIZE(sizeof (uint64_t), nLen);
  uint64_t res_n[nLen];
  memset(res_n, 0U, nLen * sizeof (uint64_t));
  uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(p_n[0U]);
  Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64((ffdhe_len(a) - 1U) / 8U + 1U,
    p_n,
    mu,
    r2_n,
    b_n,
    64U * nLen,
    sk_n,
    res_n);
  Hacl_Bignum_Convert_bn_to_bytes_be_uint64(ffdhe_len(a), res_n, res);
}